

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMux.c
# Opt level: O3

If_Obj_t * Lpk_MapTreeMux_rec(Lpk_Man_t *p,uint *pTruth,int nVars,If_Obj_t **ppLeaves)

{
  void **ppvVar1;
  uint *pCof0;
  uint *pCof1;
  int iVar2;
  uint uVar3;
  Kit_DsdNtk_t *pNtk;
  Kit_DsdNtk_t *pNtk_00;
  If_Obj_t *pIVar4;
  If_Obj_t *pFan1;
  
  iVar2 = p->vTtNodes->nSize;
  if ((iVar2 < 1) || (iVar2 == 1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  if (nVars < 4) {
    __assert_fail("nVars > 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkMux.c"
                  ,0x60,
                  "If_Obj_t *Lpk_MapTreeMux_rec(Lpk_Man_t *, unsigned int *, int, If_Obj_t **)");
  }
  ppvVar1 = p->vTtNodes->pArray;
  pCof0 = (uint *)*ppvVar1;
  pCof1 = (uint *)ppvVar1[1];
  p->fCalledOnce = 1;
  iVar2 = Lpk_MapTreeBestCofVar(p,pTruth,nVars,pCof0,pCof1);
  if (iVar2 != -1) {
    pNtk = Kit_DsdDecompose(pCof0,nVars);
    pNtk_00 = Kit_DsdDecompose(pCof1,nVars);
    if (p->pPars->fVeryVerbose != 0) {
      uVar3 = Kit_TruthSupportSize(pCof0,nVars);
      Kit_TruthSupportSize(pCof1,nVars);
      printf("Cofactoring w.r.t. var %c (%d -> %d+%d supp vars):\n",(ulong)(iVar2 + 0x61),
             (ulong)(uint)nVars,(ulong)uVar3);
      Kit_DsdPrintExpanded(pNtk);
      Kit_DsdPrintExpanded(pNtk_00);
    }
    pIVar4 = Lpk_MapTree_rec(p,pNtk,ppLeaves,(uint)pNtk->Root,(If_Obj_t *)0x0);
    pFan1 = Lpk_MapTree_rec(p,pNtk_00,ppLeaves,(uint)pNtk_00->Root,(If_Obj_t *)0x0);
    Kit_DsdNtkFree(pNtk);
    Kit_DsdNtkFree(pNtk_00);
    pIVar4 = If_ManCreateMux(p->pIfMan,pIVar4,pFan1,ppLeaves[iVar2]);
    return pIVar4;
  }
  return (If_Obj_t *)0x0;
}

Assistant:

If_Obj_t * Lpk_MapTreeMux_rec( Lpk_Man_t * p, unsigned * pTruth, int nVars, If_Obj_t ** ppLeaves )
{
    unsigned * pCof0 = (unsigned *)Vec_PtrEntry( p->vTtNodes, 0 );
    unsigned * pCof1 = (unsigned *)Vec_PtrEntry( p->vTtNodes, 1 );
    If_Obj_t * pObj0, * pObj1;
    Kit_DsdNtk_t * ppNtks[2];
    int iBestVar;
    assert( nVars > 3 );
    p->fCalledOnce = 1;
    // cofactor w.r.t. the best variable
    iBestVar = Lpk_MapTreeBestCofVar( p, pTruth, nVars, pCof0, pCof1 );
    if ( iBestVar == -1 )
        return NULL;
    // decompose the functions
    ppNtks[0] = Kit_DsdDecompose( pCof0, nVars );
    ppNtks[1] = Kit_DsdDecompose( pCof1, nVars );
    if ( p->pPars->fVeryVerbose )
    {
        printf( "Cofactoring w.r.t. var %c (%d -> %d+%d supp vars):\n", 
            'a'+iBestVar, nVars, Kit_TruthSupportSize(pCof0, nVars), Kit_TruthSupportSize(pCof1, nVars) );
        Kit_DsdPrintExpanded( ppNtks[0] );
        Kit_DsdPrintExpanded( ppNtks[1] );
    }
    // map the DSD structures
    pObj0 = Lpk_MapTree_rec( p, ppNtks[0], ppLeaves, ppNtks[0]->Root, NULL );
    pObj1 = Lpk_MapTree_rec( p, ppNtks[1], ppLeaves, ppNtks[1]->Root, NULL );
    Kit_DsdNtkFree( ppNtks[0] );
    Kit_DsdNtkFree( ppNtks[1] );
    return If_ManCreateMux( p->pIfMan, pObj0, pObj1, ppLeaves[iBestVar] );
}